

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::syncBackingStore(QWidgetPrivate *this,QRegion *region)

{
  bool bVar1;
  QWidgetRepaintManager *this_00;
  
  bVar1 = shouldPaintOnScreen(this);
  if (bVar1) {
    paintOnScreen(this,region);
    return;
  }
  this_00 = maybeRepaintManager(this);
  if (this_00 != (QWidgetRepaintManager *)0x0) {
    QWidgetRepaintManager::sync((QWidgetRepaintManager *)this_00);
    return;
  }
  return;
}

Assistant:

void QWidgetPrivate::syncBackingStore(const QRegion &region)
{
    if (shouldPaintOnScreen())
        paintOnScreen(region);
    else if (QWidgetRepaintManager *repaintManager = maybeRepaintManager()) {
        repaintManager->sync(q_func(), region);
    }
}